

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_copy.cpp
# Opt level: O1

void duckdb::VectorOperations::Copy
               (Vector *source_p,Vector *target,SelectionVector *sel_p,idx_t source_count,
               idx_t source_offset,idx_t target_offset,idx_t copy_count)

{
  ValidityMask *this;
  ulong *puVar1;
  VectorType vector_type_p;
  VectorType VVar2;
  PhysicalType PVar3;
  int64_t *piVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  sel_t *psVar5;
  byte bVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [8];
  SelectionVector *sel;
  VectorBuffer *pVVar11;
  VectorBuffer *pVVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  Vector *pVVar14;
  Vector *target_00;
  idx_t iVar15;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_02;
  const_reference this_03;
  type source_p_00;
  reference this_04;
  type target_01;
  NotImplementedException *pNVar16;
  InternalException *this_05;
  unsigned_long *puVar17;
  PhysicalType type;
  pointer pcVar18;
  long *plVar19;
  long lVar20;
  ulong uVar21;
  data_ptr_t pdVar22;
  idx_t count;
  long lVar23;
  idx_t source_offset_00;
  int iVar24;
  ulong uVar25;
  bool bVar26;
  byte bVar27;
  long lVar28;
  idx_t idx_in_entry;
  data_ptr_t pdVar29;
  size_type __n;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  string_t sVar33;
  SelectionVector child_sel_1;
  buffer_ptr<SelectionData> new_buffer;
  SelectionVector owned_sel;
  ulong local_150;
  data_ptr_t local_148;
  idx_t local_120;
  SelectionVector local_110;
  undefined1 local_f8 [8];
  LogicalType aLStack_f0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  buffer_ptr<SelectionData> local_90;
  LogicalType local_80;
  undefined1 local_68 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string local_50;
  
  local_120 = copy_count;
  local_68 = (undefined1  [16])0x0;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar26 = false;
  sel = sel_p;
  do {
    switch(source_p->vector_type) {
    case CONSTANT_VECTOR:
      sel = ConstantVector::ZeroSelectionVector(copy_count,(SelectionVector *)local_68);
    case FLAT_VECTOR:
    case FSST_VECTOR:
      bVar26 = true;
      break;
    case DICTIONARY_VECTOR:
      DictionaryVector::VerifyDictionary(source_p);
      pVVar12 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&source_p->auxiliary);
      DictionaryVector::VerifyDictionary(source_p);
      pVVar11 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&source_p->buffer);
      SelectionVector::Slice
                ((SelectionVector *)local_f8,(SelectionVector *)(pVVar11 + 1),(idx_t)sel);
      local_90.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)local_f8;
      local_90.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(aLStack_f0[0]._0_8_ + 8) =
               *(_Atomic_word *)(aLStack_f0[0]._0_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(aLStack_f0[0]._0_8_ + 8) =
               *(_Atomic_word *)(aLStack_f0[0]._0_8_ + 8) + 1;
        }
      }
      SelectionVector::Initialize((SelectionVector *)local_68,&local_90);
      if (local_90.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_);
      }
      source_p = (Vector *)(pVVar12 + 1);
      sel = (SelectionVector *)local_68;
      break;
    case SEQUENCE_VECTOR:
      LogicalType::LogicalType(&local_80,&source_p->type);
      Vector::Vector((Vector *)local_f8,&local_80,0x800);
      LogicalType::~LogicalType(&local_80);
      pVVar12 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&source_p->buffer);
      piVar4 = (int64_t *)(pVVar12->data).pointer;
      GenerateSequence((Vector *)local_f8,source_count,sel,*piVar4,piVar4[1]);
      Copy((Vector *)local_f8,target,sel,source_count,source_offset,target_offset,
           source_count - source_offset);
      if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
      }
      if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
      }
      if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_f8 + 8));
      goto LAB_0036857a;
    default:
      pNVar16 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_f8 = (undefined1  [8])&aLStack_f0[0].type_info_;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,"FIXME unimplemented vector type for VectorOperations::Copy","")
      ;
      NotImplementedException::NotImplementedException(pNVar16,(string *)local_f8);
      __cxa_throw(pNVar16,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  } while (!bVar26);
  if (copy_count == 0) goto LAB_0036857a;
  vector_type_p = target->vector_type;
  local_148 = (data_ptr_t)target_offset;
  if (vector_type_p == CONSTANT_VECTOR && copy_count == 1) {
    local_148 = (data_ptr_t)0x0;
    Vector::SetVectorType(target,FLAT_VECTOR);
  }
  FlatVector::VerifyFlatVector(target);
  this = &target->validity;
  VVar2 = source_p->vector_type;
  if (VVar2 == FLAT_VECTOR) {
    FlatVector::VerifyFlatVector(source_p);
LAB_00367a41:
    ValidityMask::CopySel(this,&source_p->validity,sel,source_offset,(idx_t)local_148,copy_count);
  }
  else {
    if (VVar2 == FSST_VECTOR) goto LAB_00367a41;
    if (VVar2 != CONSTANT_VECTOR) {
      this_05 = (InternalException *)__cxa_allocate_exception(0x10);
      local_f8 = (undefined1  [8])&aLStack_f0[0].type_info_;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,"Unsupported vector type in vector copy","");
      InternalException::InternalException(this_05,(string *)local_f8);
      __cxa_throw(this_05,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    puVar17 = (source_p->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar17 == (unsigned_long *)0x0) {
      bVar27 = 1;
    }
    else {
      bVar27 = (byte)*puVar17 & 1;
    }
    lVar20 = copy_count + (copy_count == 0);
    pdVar29 = local_148;
    do {
      puVar17 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (bVar27 == 0) {
        if (puVar17 == (unsigned_long *)0x0) {
          local_110.sel_vector =
               (sel_t *)(target->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_f8,(unsigned_long *)&local_110);
          auVar10 = local_f8;
          uVar7 = aLStack_f0[0]._0_8_;
          _local_f8 = (undefined1  [16])0x0;
          this_00 = (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)auVar10;
          (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_f0[0]._0_8_);
          }
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(target->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (this->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar6 = (byte)pdVar29 & 0x3f;
        puVar1 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 ((ulong)pdVar29 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      }
      else if (puVar17 != (unsigned_long *)0x0) {
        puVar17[(ulong)pdVar29 >> 6] = puVar17[(ulong)pdVar29 >> 6] | 1L << ((byte)pdVar29 & 0x3f);
      }
      pdVar29 = (data_ptr_t)((long)pdVar29 + 1);
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
  }
  if (source_p->vector_type == FSST_VECTOR) {
    FSSTVector::DecompressVector(source_p,target,source_offset,(idx_t)local_148,copy_count,sel);
  }
  else {
    PVar3 = (source_p->type).physical_type_;
    local_150 = source_offset;
    if (PVar3 < VARCHAR) {
      switch(PVar3) {
      case BOOL:
      case INT8:
        pdVar29 = source_p->data;
        local_148 = target->data + (long)local_148;
        do {
          uVar25 = local_150;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar25 = (ulong)sel->sel_vector[local_150];
          }
          *local_148 = pdVar29[uVar25];
          local_148 = local_148 + 1;
          local_150 = local_150 + 1;
          local_120 = local_120 - 1;
        } while (local_120 != 0);
        break;
      case UINT8:
        pdVar29 = source_p->data;
        local_148 = target->data + (long)local_148;
        do {
          uVar25 = local_150;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar25 = (ulong)sel->sel_vector[local_150];
          }
          *local_148 = pdVar29[uVar25];
          local_148 = local_148 + 1;
          local_150 = local_150 + 1;
          local_120 = local_120 - 1;
        } while (local_120 != 0);
        break;
      case UINT16:
        pdVar29 = target->data;
        pdVar22 = source_p->data;
        psVar5 = sel->sel_vector;
        iVar15 = 0;
        do {
          if (psVar5 == (sel_t *)0x0) {
            uVar25 = source_offset + iVar15;
          }
          else {
            uVar25 = (ulong)psVar5[source_offset + iVar15];
          }
          *(undefined2 *)(pdVar29 + iVar15 * 2 + (long)local_148 * 2) =
               *(undefined2 *)(pdVar22 + uVar25 * 2);
          iVar15 = iVar15 + 1;
        } while (copy_count != iVar15);
        break;
      case INT16:
        pdVar29 = target->data;
        pdVar22 = source_p->data;
        psVar5 = sel->sel_vector;
        iVar15 = 0;
        do {
          if (psVar5 == (sel_t *)0x0) {
            uVar25 = source_offset + iVar15;
          }
          else {
            uVar25 = (ulong)psVar5[source_offset + iVar15];
          }
          *(undefined2 *)(pdVar29 + iVar15 * 2 + (long)local_148 * 2) =
               *(undefined2 *)(pdVar22 + uVar25 * 2);
          iVar15 = iVar15 + 1;
        } while (copy_count != iVar15);
        break;
      case UINT32:
        pdVar29 = target->data;
        pdVar22 = source_p->data;
        psVar5 = sel->sel_vector;
        iVar15 = 0;
        do {
          if (psVar5 == (sel_t *)0x0) {
            uVar25 = source_offset + iVar15;
          }
          else {
            uVar25 = (ulong)psVar5[source_offset + iVar15];
          }
          *(undefined4 *)(pdVar29 + iVar15 * 4 + (long)local_148 * 4) =
               *(undefined4 *)(pdVar22 + uVar25 * 4);
          iVar15 = iVar15 + 1;
        } while (copy_count != iVar15);
        break;
      case INT32:
        pdVar29 = target->data;
        pdVar22 = source_p->data;
        psVar5 = sel->sel_vector;
        iVar15 = 0;
        do {
          if (psVar5 == (sel_t *)0x0) {
            uVar25 = source_offset + iVar15;
          }
          else {
            uVar25 = (ulong)psVar5[source_offset + iVar15];
          }
          *(undefined4 *)(pdVar29 + iVar15 * 4 + (long)local_148 * 4) =
               *(undefined4 *)(pdVar22 + uVar25 * 4);
          iVar15 = iVar15 + 1;
        } while (copy_count != iVar15);
        break;
      case UINT64:
        pdVar29 = target->data;
        pdVar22 = source_p->data;
        psVar5 = sel->sel_vector;
        iVar15 = 0;
        do {
          if (psVar5 == (sel_t *)0x0) {
            uVar25 = source_offset + iVar15;
          }
          else {
            uVar25 = (ulong)psVar5[source_offset + iVar15];
          }
          *(undefined8 *)(pdVar29 + iVar15 * 8 + (long)local_148 * 8) =
               *(undefined8 *)(pdVar22 + uVar25 * 8);
          iVar15 = iVar15 + 1;
        } while (copy_count != iVar15);
        break;
      case INT64:
        pdVar29 = target->data;
        pdVar22 = source_p->data;
        psVar5 = sel->sel_vector;
        iVar15 = 0;
        do {
          if (psVar5 == (sel_t *)0x0) {
            uVar25 = source_offset + iVar15;
          }
          else {
            uVar25 = (ulong)psVar5[source_offset + iVar15];
          }
          *(undefined8 *)(pdVar29 + iVar15 * 8 + (long)local_148 * 8) =
               *(undefined8 *)(pdVar22 + uVar25 * 8);
          iVar15 = iVar15 + 1;
        } while (copy_count != iVar15);
        break;
      default:
switchD_00367ba3_caseD_a:
        pNVar16 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_f8 = (undefined1  [8])&aLStack_f0[0].type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f8,"Unimplemented type \'%s\' for copy!","");
        TypeIdToString_abi_cxx11_(&local_50,(duckdb *)(ulong)(source_p->type).physical_type_,type);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (pNVar16,(string *)local_f8,&local_50);
        __cxa_throw(pNVar16,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      case FLOAT:
        pdVar29 = target->data;
        pdVar22 = source_p->data;
        psVar5 = sel->sel_vector;
        iVar15 = 0;
        do {
          if (psVar5 == (sel_t *)0x0) {
            uVar25 = source_offset + iVar15;
          }
          else {
            uVar25 = (ulong)psVar5[source_offset + iVar15];
          }
          *(undefined4 *)(pdVar29 + iVar15 * 4 + (long)local_148 * 4) =
               *(undefined4 *)(pdVar22 + uVar25 * 4);
          iVar15 = iVar15 + 1;
        } while (copy_count != iVar15);
        break;
      case DOUBLE:
        pdVar29 = target->data;
        pdVar22 = source_p->data;
        psVar5 = sel->sel_vector;
        iVar15 = 0;
        do {
          if (psVar5 == (sel_t *)0x0) {
            uVar25 = source_offset + iVar15;
          }
          else {
            uVar25 = (ulong)psVar5[source_offset + iVar15];
          }
          *(undefined8 *)(pdVar29 + iVar15 * 8 + (long)local_148 * 8) =
               *(undefined8 *)(pdVar22 + uVar25 * 8);
          iVar15 = iVar15 + 1;
        } while (copy_count != iVar15);
        break;
      case INTERVAL:
        pdVar29 = source_p->data;
        pdVar22 = target->data + (long)local_148 * 0x10;
        do {
          uVar25 = local_150;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar25 = (ulong)sel->sel_vector[local_150];
          }
          uVar7 = *(undefined8 *)(pdVar29 + uVar25 * 0x10 + 8);
          *(undefined8 *)pdVar22 = *(undefined8 *)(pdVar29 + uVar25 * 0x10);
          *(undefined8 *)(pdVar22 + 8) = uVar7;
          pdVar22 = pdVar22 + 0x10;
          local_150 = local_150 + 1;
          local_120 = local_120 - 1;
        } while (local_120 != 0);
        break;
      case LIST:
        pVVar14 = ListVector::GetEntry(source_p);
        pdVar22 = source_p->data;
        pdVar29 = target->data;
        if (vector_type_p == CONSTANT_VECTOR) {
          puVar17 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar17 == (unsigned_long *)0x0) ||
             ((puVar17[(ulong)local_148 >> 6] >> ((ulong)local_148 & 0x3f) & 1) != 0)) {
            if (sel->sel_vector != (sel_t *)0x0) {
              source_offset = (idx_t)sel->sel_vector[source_offset];
            }
            lVar28 = source_offset * 0x10;
            lVar20 = *(long *)(pdVar22 + lVar28);
            lVar23 = *(long *)(pdVar22 + lVar28 + 8);
            ListVector::SetListSize(target,0);
            ListVector::Append(target,pVVar14,lVar20 + lVar23,*(idx_t *)(pdVar22 + lVar28));
            *(idx_t *)(pdVar29 + (long)local_148 * 0x10 + 8) =
                 *(idx_t *)((long)(pdVar22 + lVar28) + 8);
            pdVar29 = pdVar29 + (long)local_148 * 0x10;
            pdVar29[0] = '\0';
            pdVar29[1] = '\0';
            pdVar29[2] = '\0';
            pdVar29[3] = '\0';
            pdVar29[4] = '\0';
            pdVar29[5] = '\0';
            pdVar29[6] = '\0';
            pdVar29[7] = '\0';
          }
        }
        else {
          _local_f8 = (undefined1  [16])0x0;
          aLStack_f0[0].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          lVar20 = 0;
          do {
            puVar17 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if ((puVar17 == (unsigned_long *)0x0) ||
               ((puVar17[(ulong)((long)local_148 + lVar20) >> 6] >>
                 ((long)local_148 + lVar20 & 0x3fU) & 1) != 0)) {
              uVar25 = lVar20 + source_offset;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar25 = (ulong)sel->sel_vector[uVar25];
              }
              if (*(long *)(pdVar22 + uVar25 * 0x10 + 8) != 0) {
                uVar21 = 0;
                do {
                  lVar23 = *(long *)(pdVar22 + uVar25 * 0x10);
                  local_110.sel_vector = (sel_t *)(uVar21 + lVar23);
                  if ((element_type *)aLStack_f0[0]._0_8_ ==
                      aLStack_f0[0].type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  {
                    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_long>
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,
                               (iterator)aLStack_f0[0]._0_8_,(unsigned_long *)&local_110);
                  }
                  else {
                    *(int *)aLStack_f0[0]._0_8_ = (int)lVar23 + (int)uVar21;
                    aLStack_f0[0]._0_8_ = (uint *)(aLStack_f0[0]._0_8_ + 4);
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar21 < *(ulong *)((long)(pdVar22 + uVar25 * 0x10) + 8));
              }
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 != copy_count + (copy_count == 0));
          auVar10 = local_f8;
          uVar7 = aLStack_f0[0]._0_8_;
          local_110.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
               (original)ZEXT816(0);
          local_110.sel_vector = (sel_t *)local_f8;
          iVar15 = ListVector::GetListSize(target);
          ListVector::Append(target,pVVar14,&local_110,uVar7 - (long)auVar10 >> 2,0);
          psVar5 = sel->sel_vector;
          puVar17 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          lVar20 = copy_count + (copy_count == 0);
          plVar19 = (long *)(pdVar29 + (long)local_148 * 0x10 + 8);
          do {
            uVar25 = source_offset;
            if (psVar5 != (sel_t *)0x0) {
              uVar25 = (ulong)psVar5[source_offset];
            }
            lVar23 = *(long *)(pdVar22 + uVar25 * 0x10 + 8);
            *plVar19 = lVar23;
            plVar19[-1] = iVar15;
            if ((puVar17 != (unsigned_long *)0x0) &&
               ((puVar17[(ulong)local_148 >> 6] >> ((ulong)local_148 & 0x3f) & 1) == 0)) {
              lVar23 = 0;
            }
            iVar15 = iVar15 + lVar23;
            local_148 = (data_ptr_t)((long)local_148 + 1);
            plVar19 = plVar19 + 2;
            source_offset = source_offset + 1;
            lVar20 = lVar20 + -1;
          } while (lVar20 != 0);
          if (local_110.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_110.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_f8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_f8);
          }
        }
        break;
      case STRUCT:
        this_01 = StructVector::GetEntries(source_p);
        this_02 = StructVector::GetEntries(target);
        if ((this_01->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this_01->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          __n = 0;
          do {
            this_03 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::operator[](this_01,__n);
            source_p_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                          operator*(this_03);
            this_04 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::operator[](this_02,__n);
            target_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(this_04);
            Copy(source_p_00,target_01,sel_p,source_count,source_offset,(idx_t)local_148,copy_count)
            ;
            __n = __n + 1;
          } while (__n < (ulong)((long)(this_01->
                                       super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                       ).
                                       super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this_01->
                                       super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                       ).
                                       super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        break;
      case ARRAY:
        pVVar14 = ArrayVector::GetEntry(source_p);
        target_00 = ArrayVector::GetEntry(target);
        iVar15 = ArrayType::GetSize(&source_p->type);
        count = source_count * iVar15;
        SelectionVector::SelectionVector((SelectionVector *)local_f8,count);
        auVar9 = _DAT_0135a310;
        auVar8 = _DAT_01352200;
        psVar5 = sel->sel_vector;
        lVar20 = iVar15 - 1;
        auVar30._8_4_ = (int)lVar20;
        auVar30._0_8_ = lVar20;
        auVar30._12_4_ = (int)((ulong)lVar20 >> 0x20);
        source_offset_00 = iVar15 * source_offset;
        pcVar18 = (pointer)((long)local_f8 + source_offset_00 * 4 + 4);
        lVar20 = 0;
        auVar30 = auVar30 ^ _DAT_01352200;
        do {
          uVar25 = source_offset + lVar20;
          if (psVar5 != (sel_t *)0x0) {
            uVar25 = (ulong)psVar5[uVar25];
          }
          if (iVar15 != 0) {
            iVar24 = (int)uVar25 * (int)iVar15;
            uVar25 = 0;
            auVar31 = auVar9;
            do {
              auVar32 = auVar31 ^ auVar8;
              if ((bool)(~(auVar30._4_4_ < auVar32._4_4_ ||
                          auVar30._0_4_ < auVar32._0_4_ && auVar32._4_4_ == auVar30._4_4_) & 1)) {
                *(int *)(pcVar18 + (uVar25 - 1) * 4) = iVar24;
              }
              if (auVar32._12_4_ <= auVar30._12_4_ &&
                  (auVar32._8_4_ <= auVar30._8_4_ || auVar32._12_4_ != auVar30._12_4_)) {
                *(int *)(pcVar18 + uVar25 * 4) = iVar24 + 1;
              }
              uVar25 = uVar25 + 2;
              lVar23 = auVar31._8_8_;
              auVar31._0_8_ = auVar31._0_8_ + 2;
              auVar31._8_8_ = lVar23 + 2;
              iVar24 = iVar24 + 2;
            } while ((iVar15 + 1 & 0xfffffffffffffffe) != uVar25);
          }
          lVar20 = lVar20 + 1;
          pcVar18 = pcVar18 + iVar15 * 4;
        } while (lVar20 != copy_count + (copy_count == 0));
        Copy(pVVar14,target_00,(SelectionVector *)local_f8,count,source_offset_00,
             iVar15 * (long)local_148,count - source_offset_00);
        if (aLStack_f0[0].type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     aLStack_f0[0].type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
    }
    else if (PVar3 == VARCHAR) {
      pdVar29 = source_p->data;
      lVar20 = copy_count + (copy_count == 0);
      pdVar22 = target->data + (long)local_148 * 0x10 + 8;
      do {
        uVar25 = local_150;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar25 = (ulong)sel->sel_vector[local_150];
        }
        puVar17 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar17 == (unsigned_long *)0x0) ||
           (puVar17 = (unsigned_long *)puVar17[(ulong)local_148 >> 6],
           ((ulong)puVar17 >> ((ulong)local_148 & 0x3f) & 1) != 0)) {
          sVar33.value.pointer.ptr = (char *)puVar17;
          sVar33.value._0_8_ = *(undefined8 *)(pdVar29 + uVar25 * 0x10 + 8);
          sVar33 = StringVector::AddStringOrBlob
                             ((StringVector *)target,*(Vector **)(pdVar29 + uVar25 * 0x10),sVar33);
          *(long *)(pdVar22 + -8) = sVar33.value._0_8_;
          *(long *)pdVar22 = sVar33.value._8_8_;
        }
        local_148 = (data_ptr_t)((long)local_148 + 1);
        pdVar22 = pdVar22 + 0x10;
        local_150 = local_150 + 1;
        lVar20 = lVar20 + -1;
      } while (lVar20 != 0);
    }
    else if (PVar3 == UINT128) {
      pdVar29 = source_p->data;
      pdVar22 = target->data + (long)local_148 * 0x10;
      do {
        uVar25 = local_150;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar25 = (ulong)sel->sel_vector[local_150];
        }
        uVar7 = *(undefined8 *)(pdVar29 + uVar25 * 0x10 + 8);
        *(undefined8 *)pdVar22 = *(undefined8 *)(pdVar29 + uVar25 * 0x10);
        *(undefined8 *)(pdVar22 + 8) = uVar7;
        pdVar22 = pdVar22 + 0x10;
        local_150 = local_150 + 1;
        local_120 = local_120 - 1;
      } while (local_120 != 0);
    }
    else {
      if (PVar3 != INT128) goto switchD_00367ba3_caseD_a;
      pdVar29 = source_p->data;
      pdVar22 = target->data + (long)local_148 * 0x10;
      do {
        uVar25 = local_150;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar25 = (ulong)sel->sel_vector[local_150];
        }
        uVar7 = *(undefined8 *)(pdVar29 + uVar25 * 0x10 + 8);
        *(undefined8 *)pdVar22 = *(undefined8 *)(pdVar29 + uVar25 * 0x10);
        *(undefined8 *)(pdVar22 + 8) = uVar7;
        pdVar22 = pdVar22 + 0x10;
        local_150 = local_150 + 1;
        local_120 = local_120 - 1;
      } while (local_120 != 0);
    }
    if (vector_type_p != FLAT_VECTOR) {
      Vector::SetVectorType(target,vector_type_p);
    }
  }
LAB_0036857a:
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  return;
}

Assistant:

void VectorOperations::Copy(const Vector &source_p, Vector &target, const SelectionVector &sel_p, idx_t source_count,
                            idx_t source_offset, idx_t target_offset, idx_t copy_count) {

	SelectionVector owned_sel;
	const SelectionVector *sel = &sel_p;

	const Vector *source = &source_p;
	bool finished = false;
	while (!finished) {
		switch (source->GetVectorType()) {
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector: merge selection vectors
			auto &child = DictionaryVector::Child(*source);
			auto &dict_sel = DictionaryVector::SelVector(*source);
			// merge the selection vectors and verify the child
			auto new_buffer = dict_sel.Slice(*sel, source_count);
			owned_sel.Initialize(new_buffer);
			sel = &owned_sel;
			source = &child;
			break;
		}
		case VectorType::SEQUENCE_VECTOR: {
			int64_t start, increment;
			Vector seq(source->GetType());
			SequenceVector::GetSequence(*source, start, increment);
			VectorOperations::GenerateSequence(seq, source_count, *sel, start, increment);
			VectorOperations::Copy(seq, target, *sel, source_count, source_offset, target_offset);
			return;
		}
		case VectorType::CONSTANT_VECTOR:
			sel = ConstantVector::ZeroSelectionVector(copy_count, owned_sel);
			finished = true;
			break;
		case VectorType::FSST_VECTOR:
			finished = true;
			break;
		case VectorType::FLAT_VECTOR:
			finished = true;
			break;
		default:
			throw NotImplementedException("FIXME unimplemented vector type for VectorOperations::Copy");
		}
	}

	if (copy_count == 0) {
		return;
	}

	// Allow copying of a single value to constant vectors
	const auto target_vector_type = target.GetVectorType();
	if (copy_count == 1 && target_vector_type == VectorType::CONSTANT_VECTOR) {
		target_offset = 0;
		target.SetVectorType(VectorType::FLAT_VECTOR);
	}
	D_ASSERT(target.GetVectorType() == VectorType::FLAT_VECTOR);

	// first copy the nullmask
	auto &tmask = FlatVector::Validity(target);
	if (source->GetVectorType() == VectorType::CONSTANT_VECTOR) {
		const bool valid = !ConstantVector::IsNull(*source);
		for (idx_t i = 0; i < copy_count; i++) {
			tmask.Set(target_offset + i, valid);
		}
	} else {
		auto &smask = ExtractValidityMask(*source);
		tmask.CopySel(smask, *sel, source_offset, target_offset, copy_count);
	}

	D_ASSERT(sel);

	// For FSST Vectors we decompress instead of copying.
	if (source->GetVectorType() == VectorType::FSST_VECTOR) {
		FSSTVector::DecompressVector(*source, target, source_offset, target_offset, copy_count, sel);
		return;
	}

	// now copy over the data
	switch (source->GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedCopy<int8_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INT16:
		TemplatedCopy<int16_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INT32:
		TemplatedCopy<int32_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INT64:
		TemplatedCopy<int64_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT8:
		TemplatedCopy<uint8_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT16:
		TemplatedCopy<uint16_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT32:
		TemplatedCopy<uint32_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT64:
		TemplatedCopy<uint64_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INT128:
		TemplatedCopy<hugeint_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT128:
		TemplatedCopy<uhugeint_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::FLOAT:
		TemplatedCopy<float>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::DOUBLE:
		TemplatedCopy<double>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INTERVAL:
		TemplatedCopy<interval_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::VARCHAR: {
		auto ldata = FlatVector::GetData<string_t>(*source);
		auto tdata = FlatVector::GetData<string_t>(target);
		for (idx_t i = 0; i < copy_count; i++) {
			auto source_idx = sel->get_index(source_offset + i);
			auto target_idx = target_offset + i;
			if (tmask.RowIsValid(target_idx)) {
				tdata[target_idx] = StringVector::AddStringOrBlob(target, ldata[source_idx]);
			}
		}
		break;
	}
	case PhysicalType::STRUCT: {
		auto &source_children = StructVector::GetEntries(*source);
		auto &target_children = StructVector::GetEntries(target);
		D_ASSERT(source_children.size() == target_children.size());
		for (idx_t i = 0; i < source_children.size(); i++) {
			VectorOperations::Copy(*source_children[i], *target_children[i], sel_p, source_count, source_offset,
			                       target_offset, copy_count);
		}
		break;
	}
	case PhysicalType::ARRAY: {
		D_ASSERT(target.GetType().InternalType() == PhysicalType::ARRAY);
		D_ASSERT(ArrayType::GetSize(source->GetType()) == ArrayType::GetSize(target.GetType()));

		auto &source_child = ArrayVector::GetEntry(*source);
		auto &target_child = ArrayVector::GetEntry(target);
		auto array_size = ArrayType::GetSize(source->GetType());

		// Create a selection vector for the child elements
		SelectionVector child_sel(source_count * array_size);
		for (idx_t i = 0; i < copy_count; i++) {
			auto source_idx = sel->get_index(source_offset + i);
			for (idx_t j = 0; j < array_size; j++) {
				child_sel.set_index((source_offset * array_size) + (i * array_size + j), source_idx * array_size + j);
			}
		}
		VectorOperations::Copy(source_child, target_child, child_sel, source_count * array_size,
		                       source_offset * array_size, target_offset * array_size);
		break;
	}
	case PhysicalType::LIST: {
		D_ASSERT(target.GetType().InternalType() == PhysicalType::LIST);

		auto &source_child = ListVector::GetEntry(*source);
		auto sdata = FlatVector::GetData<list_entry_t>(*source);
		auto tdata = FlatVector::GetData<list_entry_t>(target);

		if (target_vector_type == VectorType::CONSTANT_VECTOR) {
			// If we are only writing one value, then the copied values (if any) are contiguous
			// and we can just Append from the offset position
			if (!tmask.RowIsValid(target_offset)) {
				break;
			}
			auto source_idx = sel->get_index(source_offset);
			auto &source_entry = sdata[source_idx];
			const idx_t source_child_size = source_entry.length + source_entry.offset;

			//! overwrite constant target vectors.
			ListVector::SetListSize(target, 0);
			ListVector::Append(target, source_child, source_child_size, source_entry.offset);

			auto &target_entry = tdata[target_offset];
			target_entry.length = source_entry.length;
			target_entry.offset = 0;
		} else {
			//! if the source has list offsets, we need to append them to the target
			//! build a selection vector for the copied child elements
			vector<sel_t> child_rows;
			for (idx_t i = 0; i < copy_count; ++i) {
				if (tmask.RowIsValid(target_offset + i)) {
					auto source_idx = sel->get_index(source_offset + i);
					auto &source_entry = sdata[source_idx];
					for (idx_t j = 0; j < source_entry.length; ++j) {
						child_rows.emplace_back(source_entry.offset + j);
					}
				}
			}
			idx_t source_child_size = child_rows.size();
			SelectionVector child_sel(child_rows.data());

			idx_t old_target_child_len = ListVector::GetListSize(target);

			//! append to list itself
			ListVector::Append(target, source_child, child_sel, source_child_size);

			//! now write the list offsets
			for (idx_t i = 0; i < copy_count; i++) {
				auto source_idx = sel->get_index(source_offset + i);
				auto &source_entry = sdata[source_idx];
				auto &target_entry = tdata[target_offset + i];

				target_entry.length = source_entry.length;
				target_entry.offset = old_target_child_len;
				if (tmask.RowIsValid(target_offset + i)) {
					old_target_child_len += target_entry.length;
				}
			}
		}
		break;
	}
	default:
		throw NotImplementedException("Unimplemented type '%s' for copy!",
		                              TypeIdToString(source->GetType().InternalType()));
	}

	if (target_vector_type != VectorType::FLAT_VECTOR) {
		target.SetVectorType(target_vector_type);
	}
}